

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

pair<unsigned_int,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  pair<unsigned_int,_bool> pVar4;
  ulong uVar5;
  uint in_EDX;
  ulong uVar6;
  int iVar7;
  locType pos;
  long local_28;
  long lVar3;
  
  if (this->depth == 0) {
    pVar4.first = 0;
    pVar4.second = false;
    pVar4._5_3_ = 0;
    return pVar4;
  }
  lVar3 = this->root;
  if (this->depth < 1) {
LAB_0010bf1e:
    if (*(ulong *)(lVar3 + 0x328 + (long)(int)in_EDX * 8) <= *key) {
      uVar6 = (ulong)*(uint *)(lVar3 + (long)(int)in_EDX * 4);
      uVar5 = 0x100000000;
      goto LAB_0010bf41;
    }
  }
  else {
    iVar7 = 0;
    local_28 = lVar3;
    do {
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,&local_28);
      lVar3 = CONCAT44(extraout_var,iVar2);
      uVar1 = *(uint *)(lVar3 + 0x640);
      in_EDX = 0;
      if (0 < (long)(int)uVar1) {
        uVar6 = 0;
        do {
          if (*key <= *(ulong *)(lVar3 + 0x328 + uVar6 * 8)) {
            iVar2 = this->depth;
            in_EDX = (uint)uVar6;
            if (iVar2 + -1 <= iVar7) goto LAB_0010bf0d;
            if (*key < *(ulong *)(lVar3 + 0x328 + uVar6 * 8)) goto LAB_0010bede;
            local_28 = *(long *)(lVar3 + 8 + uVar6 * 8);
            goto LAB_0010bf0d;
          }
          uVar6 = uVar6 + 1;
          in_EDX = uVar1;
        } while ((long)(int)uVar1 != uVar6);
      }
      iVar2 = this->depth;
      if (iVar7 < iVar2 + -1) {
        uVar6 = (ulong)in_EDX;
LAB_0010bede:
        local_28 = *(long *)(lVar3 + uVar6 * 8);
      }
LAB_0010bf0d:
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar2);
    if (in_EDX != uVar1) goto LAB_0010bf1e;
  }
  uVar6 = 0;
  uVar5 = 0;
LAB_0010bf41:
  return (pair<unsigned_int,_bool>)(uVar6 | uVar5);
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }